

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * wasm::operator<<(ostream *os,ErrorReason reason)

{
  long lVar1;
  char *pcVar2;
  
  switch(reason) {
  case SelfSupertype:
    pcVar2 = "Heap type is a supertype of itself";
    break;
  case InvalidSupertype:
    pcVar2 = "Heap type has an invalid supertype";
    break;
  case ForwardSupertypeReference:
    pcVar2 = "Heap type has an undeclared supertype";
    goto LAB_00cc3d6f;
  case ForwardChildReference:
    pcVar2 = "Heap type has an undeclared child";
    lVar1 = 0x21;
    goto LAB_00cc3d8b;
  case InvalidFuncType:
    pcVar2 = "Continuation has invalid function type";
    goto LAB_00cc3d25;
  case InvalidUnsharedField:
    pcVar2 = "Heap type has an invalid unshared field";
    goto LAB_00cc3d61;
  case NonStructDescribes:
    pcVar2 = "Describes clause on a non-struct type";
LAB_00cc3d6f:
    lVar1 = 0x25;
    goto LAB_00cc3d8b;
  case ForwardDescribesReference:
    pcVar2 = "Describes clause is a forward reference";
LAB_00cc3d61:
    lVar1 = 0x27;
    goto LAB_00cc3d8b;
  case MismatchedDescribes:
    pcVar2 = "Described type is not a matching descriptor";
    goto LAB_00cc3d86;
  case NonStructDescriptor:
    pcVar2 = "Descriptor clause on a non-struct type";
LAB_00cc3d25:
    lVar1 = 0x26;
    goto LAB_00cc3d8b;
  case MismatchedDescriptor:
    pcVar2 = "Descriptor type does not describe heap type";
LAB_00cc3d86:
    lVar1 = 0x2b;
    goto LAB_00cc3d8b;
  case InvalidUnsharedDescriptor:
    pcVar2 = "Heap type has an invalid unshared descriptor";
    goto LAB_00cc3d17;
  case InvalidUnsharedDescribes:
    pcVar2 = "Heap type describes an invalid unshared type";
LAB_00cc3d17:
    lVar1 = 0x2c;
    goto LAB_00cc3d8b;
  default:
    handle_unreachable("Unexpected error reason",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x5cc);
  }
  lVar1 = 0x22;
LAB_00cc3d8b:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, TypeBuilder::ErrorReason reason) {
  switch (reason) {
    case TypeBuilder::ErrorReason::SelfSupertype:
      return os << "Heap type is a supertype of itself";
    case TypeBuilder::ErrorReason::InvalidSupertype:
      return os << "Heap type has an invalid supertype";
    case TypeBuilder::ErrorReason::ForwardSupertypeReference:
      return os << "Heap type has an undeclared supertype";
    case TypeBuilder::ErrorReason::ForwardChildReference:
      return os << "Heap type has an undeclared child";
    case TypeBuilder::ErrorReason::InvalidFuncType:
      return os << "Continuation has invalid function type";
    case TypeBuilder::ErrorReason::InvalidUnsharedField:
      return os << "Heap type has an invalid unshared field";
    case TypeBuilder::ErrorReason::NonStructDescribes:
      return os << "Describes clause on a non-struct type";
    case TypeBuilder::ErrorReason::ForwardDescribesReference:
      return os << "Describes clause is a forward reference";
    case TypeBuilder::ErrorReason::MismatchedDescribes:
      return os << "Described type is not a matching descriptor";
    case TypeBuilder::ErrorReason::NonStructDescriptor:
      return os << "Descriptor clause on a non-struct type";
    case TypeBuilder::ErrorReason::MismatchedDescriptor:
      return os << "Descriptor type does not describe heap type";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescriptor:
      return os << "Heap type has an invalid unshared descriptor";
    case TypeBuilder::ErrorReason::InvalidUnsharedDescribes:
      return os << "Heap type describes an invalid unshared type";
  }
  WASM_UNREACHABLE("Unexpected error reason");
}